

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *it,uint32_t *buf,uint32_t count)

{
  uint8_t uVar1;
  int iVar2;
  uint32_t uVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  _Bool _Var7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong *puVar15;
  bool bVar16;
  
  if ((count == 0) || (it->has_value == false)) {
    return 0;
  }
  uVar11 = 0;
  do {
    uVar1 = it->typecode;
    if (uVar1 == '\x03') {
      piVar5 = (int *)it->container;
      lVar4 = *(long *)(piVar5 + 2);
      do {
        uVar14 = (uint)*(ushort *)(lVar4 + 2 + (long)it->run_index * 4) +
                 (uint)*(ushort *)(lVar4 + (long)it->run_index * 4) | it->highbits;
        uVar10 = (uVar14 - it->current_value) + 1;
        uVar13 = count - uVar11;
        if (uVar10 < count - uVar11) {
          uVar13 = uVar10;
        }
        if (uVar13 != 0) {
          uVar12 = 0;
          do {
            buf[uVar12] = it->current_value + (int)uVar12;
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
        }
        uVar3 = it->current_value;
        it->current_value = uVar3 + uVar13;
        if (uVar14 <= (uVar3 + uVar13) - 1) {
          iVar2 = it->run_index;
          iVar9 = iVar2 + 1;
          it->run_index = iVar9;
          if (iVar9 < *piVar5) {
            it->current_value = (uint)*(ushort *)(lVar4 + 4 + (long)iVar2 * 4) | it->highbits;
          }
          else {
            it->has_value = false;
          }
        }
        buf = buf + uVar13;
        uVar11 = uVar11 + uVar13;
      } while ((uVar11 < count) && (it->has_value != false));
    }
    else if (uVar1 == '\x02') {
      piVar5 = (int *)it->container;
      uVar10 = *piVar5 - it->in_container_index;
      uVar13 = count - uVar11;
      if (uVar10 < count - uVar11) {
        uVar13 = uVar10;
      }
      if (uVar13 != 0) {
        lVar4 = *(long *)(piVar5 + 2);
        uVar12 = 0;
        do {
          buf[uVar12] = (uint)*(ushort *)
                               (lVar4 + (ulong)(uint)(it->in_container_index + (int)uVar12) * 2) |
                        it->highbits;
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
      uVar11 = uVar11 + uVar13;
      iVar9 = uVar13 + it->in_container_index;
      buf = buf + uVar13;
      it->in_container_index = iVar9;
      iVar2 = *piVar5;
      it->has_value = iVar9 < iVar2;
      if (iVar9 < iVar2) {
        it->current_value =
             (uint)*(ushort *)(*(long *)(piVar5 + 2) + (long)iVar9 * 2) | it->highbits;
      }
    }
    else {
      if (uVar1 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x41b3,
                      "uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *, uint32_t *, uint32_t)"
                     );
      }
      iVar2 = it->in_container_index;
      iVar9 = iVar2 + 0x3f;
      if (-1 < iVar2) {
        iVar9 = iVar2;
      }
      uVar8 = (ulong)(uint)(iVar9 >> 6);
      lVar4 = *(long *)((long)it->container + 8);
      uVar12 = (*(ulong *)(lVar4 + uVar8 * 8) >> ((byte)iVar2 & 0x3f)) << ((byte)iVar2 & 0x3f);
      do {
        bVar16 = uVar11 < count;
        if ((uVar12 != 0) && (uVar11 < count)) {
          do {
            lVar6 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            *buf = (uint)lVar6 | (int)uVar8 << 6 | it->highbits;
            buf = buf + 1;
            uVar11 = uVar11 + 1;
            bVar16 = uVar11 < count;
            uVar12 = uVar12 - 1 & uVar12;
          } while ((uVar12 != 0) && (uVar11 < count));
        }
        if ((uVar12 == 0) && (uVar13 = (int)uVar8 + 1, uVar13 < 0x400)) {
          puVar15 = (ulong *)(lVar4 + (ulong)uVar13 * 8);
          do {
            uVar13 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar13;
            uVar12 = *puVar15;
            if (uVar12 != 0) break;
            puVar15 = puVar15 + 1;
          } while (uVar13 < 0x3ff);
        }
      } while ((bool)(uVar12 != 0 & bVar16));
      it->has_value = uVar12 != 0;
      if (uVar12 != 0) {
        lVar4 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar13 = (uint)lVar4 | (int)uVar8 << 6;
        it->in_container_index = uVar13;
        it->current_value = uVar13 | it->highbits;
      }
    }
    if (it->has_value == true) {
      if (uVar11 == count) {
        return uVar11;
      }
      __assert_fail("ret == count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x41b6,
                    "uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *, uint32_t *, uint32_t)"
                   );
    }
    it->container_index = it->container_index + 1;
    _Var7 = loadfirstvalue(it);
    it->has_value = _Var7;
    if (!_Var7) {
      return uVar11;
    }
    if (count <= uVar11) {
      return uVar11;
    }
  } while( true );
}

Assistant:

uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *it, uint32_t* buf, uint32_t count) {
  uint32_t ret = 0;
  uint32_t num_values;
  uint32_t wordindex;  // used for bitsets
  uint64_t word;       // used for bitsets
  const array_container_t* acont; //TODO remove
  const run_container_t* rcont; //TODO remove
  const bitset_container_t* bcont; //TODO remove

  while (it->has_value && ret < count) {
    switch (it->typecode) {
      case BITSET_CONTAINER_TYPE:
        bcont = const_CAST_bitset(it->container);
        wordindex = it->in_container_index / 64;
        word = bcont->words[wordindex] & (UINT64_MAX << (it->in_container_index % 64));
        do {
          while (word != 0 && ret < count) {
            buf[0] = it->highbits | (wordindex * 64 + __builtin_ctzll(word));
            word = word & (word - 1);
            buf++;
            ret++;
          }
          while (word == 0 && wordindex+1 < BITSET_CONTAINER_SIZE_IN_WORDS) {
            wordindex++;
            word = bcont->words[wordindex];
          }
        } while (word != 0 && ret < count);
        it->has_value = (word != 0);
        if (it->has_value) {
          it->in_container_index = wordindex * 64 + __builtin_ctzll(word);
          it->current_value = it->highbits | it->in_container_index;
        }
        break;
      case ARRAY_CONTAINER_TYPE:
        acont = const_CAST_array(it->container);
        num_values = minimum_uint32(acont->cardinality - it->in_container_index, count - ret);
        for (uint32_t i = 0; i < num_values; i++) {
          buf[i] = it->highbits | acont->array[it->in_container_index + i];
        }
        buf += num_values;
        ret += num_values;
        it->in_container_index += num_values;
        it->has_value = (it->in_container_index < acont->cardinality);
        if (it->has_value) {
          it->current_value = it->highbits | acont->array[it->in_container_index];
        }
        break;
      case RUN_CONTAINER_TYPE:
        rcont = const_CAST_run(it->container);
        //"in_run_index" name is misleading, read it as "max_value_in_current_run"
        do {
          uint32_t largest_run_value = it->highbits | (rcont->runs[it->run_index].value + rcont->runs[it->run_index].length);
          num_values = minimum_uint32(largest_run_value - it->current_value + 1, count - ret);
          for (uint32_t i = 0; i < num_values; i++) {
            buf[i] = it->current_value + i;
          }
          it->current_value += num_values; // this can overflow to zero: UINT32_MAX+1=0
          buf += num_values;
          ret += num_values;

          if (it->current_value > largest_run_value || it->current_value == 0) {
            it->run_index++;
            if (it->run_index < rcont->n_runs) {
              it->current_value = it->highbits | rcont->runs[it->run_index].value;
            } else {
              it->has_value = false;
            }
          }
        } while ((ret < count) && it->has_value);
        break;
      default:
        assert(false);
    }
    if (it->has_value) {
      assert(ret == count);
      return ret;
    }
    it->container_index++;
    it->has_value = loadfirstvalue(it);
  }
  return ret;
}